

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.c
# Opt level: O0

input_t inputroutine_kempston(tgestate_t *state)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long in_RDI;
  int carry_out_4;
  int carry_out_3;
  int carry_out_2;
  int carry_out_1;
  int carry_out;
  input_t fire;
  int carry;
  input_t up_down;
  input_t left_right;
  uint8_t keybits;
  undefined4 local_1c;
  undefined4 local_14;
  undefined4 local_10;
  
  bVar1 = (*(code *)**(undefined8 **)(in_RDI + 0x18))(*(undefined8 *)(in_RDI + 0x18),0x1f);
  local_14 = 0;
  local_10 = 0;
  uVar2 = (int)(uint)bVar1 >> 1;
  if ((bVar1 & 1) != 0) {
    local_10 = 6;
  }
  uVar3 = (int)(uint)bVar1 >> 2;
  if ((uVar2 & 1) != 0) {
    local_10 = 3;
  }
  uVar4 = (int)(uint)(byte)((byte)uVar3 | bVar1 << 7) >> 1;
  if ((uVar3 & 1) != 0) {
    local_14 = 2;
  }
  if ((uVar4 & 1) != 0) {
    local_14 = 1;
  }
  local_1c = 9;
  if (((int)(uint)(byte)((byte)uVar4 | (byte)((uVar2 & 1) << 7)) >> 1 & 1U) == 0) {
    local_1c = 0;
  }
  return local_1c + local_10 + local_14;
}

Assistant:

static input_t inputroutine_kempston(tgestate_t *state)
{
  uint8_t keybits;    /* was A */
  input_t left_right; /* was B */
  input_t up_down;    /* was C */
  int     carry = 0;  /* was flags */
  input_t fire;       /* was A */

  assert(state != NULL);

  keybits = state->speccy->in(state->speccy, 0x001F);

  left_right = up_down = 0;

  RR(keybits);
  if (carry)
    left_right = input_RIGHT;

  RR(keybits);
  if (carry)
    left_right = input_LEFT;

  RR(keybits);
  if (carry)
    up_down = input_DOWN;

  RR(keybits);
  if (carry)
    up_down = input_UP;

  RR(keybits);
  fire = input_FIRE;
  if (!carry)
    fire = 0;

  return fire + left_right + up_down; /* Combine axis */
}